

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

string * __thiscall
pbrt::PortalImageInfiniteLight::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PortalImageInfiniteLight *this)

{
  string local_40;
  
  LightBase::BaseToString_abi_cxx11_(&local_40,&this->super_LightBase);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string,std::__cxx11::string_const&,float_const&,pstd::array<pbrt::Point3<float>,4>const&,pbrt::Frame_const&>
            (__return_storage_ptr__,
             "[ PortalImageInfiniteLight %s filename:%s scale: %f portal: %s  portalFrame: %s ]",
             &local_40,&this->filename,&this->scale,&this->portal,&this->portalFrame);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PortalImageInfiniteLight::ToString() const {
    return StringPrintf("[ PortalImageInfiniteLight %s filename:%s scale: %f portal: %s "
                        " portalFrame: %s ]",
                        BaseToString(), filename, scale, portal, portalFrame);
}